

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O1

RealType __thiscall OpenMD::Molecule::getFixedCharge(Molecule *this)

{
  bool bVar1;
  Atom *pAVar2;
  pointer ppAVar3;
  RealType RVar4;
  FixedChargeAdapter fca;
  double local_28;
  FixedChargeAdapter local_20;
  
  ppAVar3 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar3 ==
      (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pAVar2 = (Atom *)0x0;
  }
  else {
    pAVar2 = *ppAVar3;
  }
  if (pAVar2 == (Atom *)0x0) {
    local_28 = 0.0;
  }
  else {
    local_28 = 0.0;
    do {
      ppAVar3 = ppAVar3 + 1;
      local_20.at_ = pAVar2->atomType_;
      bVar1 = FixedChargeAdapter::isFixedCharge(&local_20);
      if (bVar1) {
        RVar4 = FixedChargeAdapter::getCharge(&local_20);
        local_28 = local_28 + RVar4;
      }
      if (ppAVar3 ==
          (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        pAVar2 = (Atom *)0x0;
      }
      else {
        pAVar2 = *ppAVar3;
      }
    } while (pAVar2 != (Atom *)0x0);
  }
  return local_28;
}

Assistant:

RealType Molecule::getFixedCharge() {
    Atom* atom;
    std::vector<Atom*>::iterator i;
    RealType q = 0.0;

    for (atom = beginAtom(i); atom != NULL; atom = nextAtom(i)) {
      AtomType* atomType = atom->getAtomType();

      FixedChargeAdapter fca = FixedChargeAdapter(atomType);
      if (fca.isFixedCharge()) { q += fca.getCharge(); }
    }

    return q;
  }